

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O3

void btree_reverse_iterator_test(void)

{
  btree_result bVar1;
  filemgr_ops *ops;
  btree_kv_ops *kv_ops;
  btree_blk_ops *blk_ops;
  long *extraout_RDX;
  uint64_t uVar2;
  long lVar3;
  uint64_t *key_buf;
  char *__format;
  btreeblk_handle *handle;
  long lVar4;
  ulong uVar5;
  filemgr_open_result fVar6;
  uint64_t v;
  uint64_t k;
  btree_kv_ops *local_1d0;
  filemgr *local_1c8;
  btree_iterator bi;
  btreeblk_handle bhandle;
  btree btree;
  timeval __test_begin;
  filemgr_config config;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  btreeblock_testfile");
  memleak_start();
  config.flag = 0;
  config.chunksize = 0;
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.blocksize = 0x100;
  config.ncacheblock = 0;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  ops = get_filemgr_ops();
  fVar6 = filemgr_open("./btreeblock_testfile",ops,&config,(err_log_callback *)0x0);
  local_1c8 = fVar6.file;
  btreeblk_init(&bhandle,local_1c8,0x100);
  kv_ops = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  blk_ops = btreeblk_get_ops();
  local_1d0 = kv_ops;
  btree_init(&btree,&bhandle,blk_ops,kv_ops,0x100,'\b','\b',0,(btree_meta *)0x0);
  lVar4 = 0x1e;
  lVar3 = -0x6000000000000000;
  uVar5 = 0xa00000000000;
  uVar2 = 0xa000000000000;
  do {
    k = (uVar5 & 0xffff000000000000) + lVar3;
    v = uVar2;
    btree_insert(&btree,&k,&v);
    btreeblk_end(&bhandle);
    lVar3 = lVar3 + 0x1000000000000000;
    uVar5 = uVar5 + 0x100000000000;
    uVar2 = uVar2 + 0x1000000000000;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  btree_iterator_init(&btree,&bi,(void *)0x0);
  key_buf = &k;
  bVar1 = btree_next(&bi,key_buf,&v);
  if (bVar1 == BTREE_RESULT_SUCCESS) {
    uVar5 = 0xa0;
    uVar2 = 0xa00;
    lVar3 = 0x1e;
    do {
      btreeblk_end(&bhandle);
      k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
          (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
          (k & 0xff00) << 0x28 | k << 0x38;
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      if (uVar5 != k) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x278);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar5 != k) goto LAB_00106b15;
      }
      if (uVar2 != v) {
        btree_reverse_iterator_test();
      }
      key_buf = &k;
      bVar1 = btree_next(&bi,&k,&v);
      uVar5 = uVar5 + 0x10;
      uVar2 = uVar2 + 0x100;
      lVar3 = lVar3 + -1;
    } while (bVar1 == BTREE_RESULT_SUCCESS);
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    if (lVar3 != 0) goto LAB_00106c05;
    k = 0x1027000000000000;
    btree_iterator_init(&btree,&bi,&k);
    bVar1 = btree_next(&bi,&k,&v);
    if (bVar1 == BTREE_RESULT_SUCCESS) {
      do {
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        bVar1 = btree_next(&bi,&k,&v);
      } while (bVar1 == BTREE_RESULT_SUCCESS);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    btree_iterator_init(&btree,&bi,(void *)0x0);
    bVar1 = btree_prev(&bi,&k,&v);
    if (bVar1 == BTREE_RESULT_SUCCESS) {
      do {
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        bVar1 = btree_prev(&bi,&k,&v);
      } while (bVar1 == BTREE_RESULT_SUCCESS);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    key_buf = &k;
    k = 0x1027000000000000;
    btree_iterator_init(&btree,&bi,key_buf);
    bVar1 = btree_prev(&bi,key_buf,&v);
    if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106c0a;
    uVar5 = 0x270;
    uVar2 = 0x2700;
    lVar3 = 0x1e;
    do {
      btreeblk_end(&bhandle);
      k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
          (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
          (k & 0xff00) << 0x28 | k << 0x38;
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      if (uVar5 != k) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x2a1);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar5 != k) {
          __assert_fail("k == (uint64_t)(39-c)*0x10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2a1,"void btree_reverse_iterator_test()");
        }
      }
      if (uVar2 != v) {
        btree_reverse_iterator_test();
      }
      key_buf = &k;
      bVar1 = btree_prev(&bi,&k,&v);
      uVar5 = uVar5 - 0x10;
      uVar2 = uVar2 - 0x100;
      lVar3 = lVar3 + -1;
    } while (bVar1 == BTREE_RESULT_SUCCESS);
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    if (lVar3 != 0) goto LAB_00106c21;
    key_buf = &k;
    k = 0x7501000000000000;
    btree_iterator_init(&btree,&bi,key_buf);
    bVar1 = btree_prev(&bi,key_buf,&v);
    if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106c26;
    uVar5 = 0x170;
    uVar2 = 0x1700;
    lVar3 = 0xe;
    do {
      btreeblk_end(&bhandle);
      k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
          (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
          (k & 0xff00) << 0x28 | k << 0x38;
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      if (uVar5 != k) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x2b1);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar5 != k) {
          __assert_fail("k == (uint64_t)(0x17-c)*0x10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2b1,"void btree_reverse_iterator_test()");
        }
      }
      if (uVar2 != v) {
        btree_reverse_iterator_test();
      }
      key_buf = &k;
      bVar1 = btree_prev(&bi,&k,&v);
      uVar5 = uVar5 - 0x10;
      uVar2 = uVar2 - 0x100;
      lVar3 = lVar3 + -1;
    } while (bVar1 == BTREE_RESULT_SUCCESS);
    btreeblk_end(&bhandle);
    handle = (btreeblk_handle *)&bi;
    btree_iterator_free((btree_iterator *)handle);
    if (lVar3 == 0) {
      btree_iterator_init(&btree,&bi,(void *)0x0);
      uVar5 = 0xa0;
      uVar2 = 0xa00;
      do {
        bVar1 = btree_next(&bi,&k,&v);
        if (bVar1 != BTREE_RESULT_SUCCESS) {
          btree_reverse_iterator_test();
          goto LAB_00106b06;
        }
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        if (uVar5 != k) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2c2);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar5 != k) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2c2,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar2 != v) {
          btree_reverse_iterator_test();
        }
        uVar5 = uVar5 + 0x10;
        uVar2 = uVar2 + 0x100;
      } while (uVar5 != 400);
      uVar5 = 0x170;
      uVar2 = 0x1700;
      do {
        bVar1 = btree_prev(&bi,&k,&v);
        if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b06;
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        if (uVar5 != k) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2cc);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar5 != k) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2cc,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar2 != v) {
          btree_reverse_iterator_test();
        }
        uVar5 = uVar5 - 0x10;
        uVar2 = uVar2 - 0x100;
      } while (uVar5 != 0x100);
      uVar5 = 0x120;
      uVar2 = 0x1200;
      do {
        bVar1 = btree_next(&bi,&k,&v);
        if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b0b;
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        if (uVar5 != k) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2d6);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar5 != k) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2d6,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar2 != v) {
          btree_reverse_iterator_test();
        }
        uVar5 = uVar5 + 0x10;
        uVar2 = uVar2 + 0x100;
      } while (uVar5 != 0x1c0);
      uVar5 = 0x1a0;
      uVar2 = 0x1a00;
      do {
        bVar1 = btree_prev(&bi,&k,&v);
        if (bVar1 != BTREE_RESULT_SUCCESS) goto LAB_00106b10;
        btreeblk_end(&bhandle);
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        if (uVar5 != k) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                 );
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar5 != k) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2e0,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar2 != v) {
          btree_reverse_iterator_test();
        }
        uVar5 = uVar5 - 0x10;
        uVar2 = uVar2 - 0x100;
      } while (uVar5 != 0x90);
      key_buf = &k;
      bVar1 = btree_prev(&bi,key_buf,&v);
      handle = &bhandle;
      btreeblk_end(handle);
      if (bVar1 == BTREE_RESULT_FAIL) {
        btree_iterator_free(&bi);
        free(local_1d0);
        btreeblk_free(&bhandle);
        filemgr_close(local_1c8,true,(char *)0x0,(err_log_callback *)0x0);
        filemgr_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (btree_reverse_iterator_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"btree reverse iterator test");
        return;
      }
      goto LAB_00106c42;
    }
  }
  else {
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
LAB_00106c05:
    btree_reverse_iterator_test();
LAB_00106c0a:
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
LAB_00106c21:
    btree_reverse_iterator_test();
LAB_00106c26:
    btreeblk_end(&bhandle);
    handle = (btreeblk_handle *)&bi;
    btree_iterator_free((btree_iterator *)handle);
  }
  btree_reverse_iterator_test();
LAB_00106c42:
  btree_reverse_iterator_test();
  sprintf(load_test_next_kv::kk,"k%07lu",*extraout_RDX);
  sprintf(load_test_next_kv::vv,"v%07lu",*extraout_RDX);
  *extraout_RDX = *extraout_RDX + 1;
  *(char **)handle = load_test_next_kv::kk;
  *key_buf = (uint64_t)load_test_next_kv::vv;
  return;
LAB_00106b06:
  btree_reverse_iterator_test();
LAB_00106b0b:
  btree_reverse_iterator_test();
LAB_00106b10:
  btree_reverse_iterator_test();
LAB_00106b15:
  __assert_fail("k == (uint64_t)(c+10)*0x10",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x278,"void btree_reverse_iterator_test()");
}

Assistant:

void btree_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, c;
    int nodesize = 256;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree btree;
    struct btree_iterator bi;
    struct filemgr_config config;
    struct btree_kv_ops *kv_ops;
    btree_result br;
    filemgr_open_result fr;
    uint64_t i;
    uint64_t k,v;
    char *fname = (char *) "./btreeblock_testfile";

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;

    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    kv_ops = btree_kv_get_kb64_vb64(NULL);
    btree_init(&btree, (void*)&bhandle,
               btreeblk_get_ops(), kv_ops,
               nodesize, ksize, vsize, 0x0, NULL);

    for (i=10;i<40;++i) {
        k = _endian_encode(i*0x10);
        v = _endian_encode(i*0x100);
        btree_insert(&btree, (void*)&k, (void*)&v);
        btreeblk_end(&bhandle);
    }

    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(c+10)*0x10);
        TEST_CHK(v == (uint64_t)(c+10)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    // reverse iteration with NULL initial key
    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(39-c)*0x10);
        TEST_CHK(v == (uint64_t)(39-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=0x175;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(0x17-c)*0x10);
        TEST_CHK(v == (uint64_t)(0x17-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 14);

    c = 0xa0 - 0x10;
    btree_iterator_init(&btree, &bi, NULL);
    for (i=0;i<15;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<7;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<10;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<17;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    br = btree_prev(&bi, &k, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btree_iterator_free(&bi);

    free(kv_ops);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    memleak_end();

    TEST_RESULT("btree reverse iterator test");
}